

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.h
# Opt level: O2

size_t __thiscall
embree::FastAllocator::Block::getAllocatedBytes(Block *this,AllocationType atype,bool huge_pages)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  Block *block;
  size_t sVar4;
  
  sVar4 = 0;
  for (; this != (Block *)0x0; this = this->next) {
    bVar2 = hasType(this,atype,huge_pages);
    if (bVar2) {
      uVar1 = (this->allocEnd).super___atomic_base<unsigned_long>._M_i;
      uVar3 = (this->cur).super___atomic_base<unsigned_long>._M_i;
      if (uVar3 < uVar1) {
        uVar3 = uVar1;
      }
      uVar1 = (this->reserveEnd).super___atomic_base<unsigned_long>._M_i;
      if (uVar1 <= uVar3) {
        uVar3 = uVar1;
      }
      sVar4 = sVar4 + uVar3;
    }
  }
  return sVar4;
}

Assistant:

size_t getAllocatedBytes(AllocationType atype, bool huge_pages = false) const {
        size_t bytes = 0;
        for (const Block* block = this; block; block = block->next) {
          if (!block->hasType(atype,huge_pages)) continue;
          bytes += block->getBlockAllocatedBytes();
        }
        return bytes;
      }